

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::NetworkCommsInterface
          (NetworkCommsInterface *this,InterfaceTypes type,thread_generation threads)

{
  undefined4 in_EDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  PortAllocator *in_stack_00000040;
  thread_generation in_stack_0000007c;
  CommsInterface *in_stack_00000080;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar1;
  
  uVar1 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  CommsInterface::CommsInterface(in_stack_00000080,in_stack_0000007c);
  *in_RDI = &PTR__NetworkCommsInterface_0095beb8;
  *(undefined4 *)(in_RDI + 0x82) = 0xffffffff;
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(uVar1,in_EDX),(__integral_type_conflict)((ulong)in_RDI >> 0x20)
            );
  *(undefined1 *)(in_RDI + 0x83) = 1;
  *(undefined1 *)((long)in_RDI + 0x419) = 0;
  *(undefined1 *)((long)in_RDI + 0x41a) = 0;
  *(undefined1 *)((long)in_RDI + 0x41b) = 0;
  *(undefined1 *)((long)in_RDI + 0x41c) = 0;
  *(undefined1 *)((long)in_RDI + 0x41d) = 0;
  *(char *)((long)in_RDI + 0x41e) = (char)((uint)uVar1 >> 0x18);
  *(undefined1 *)((long)in_RDI + 0x41f) = 4;
  std::atomic<bool>::atomic((atomic<bool> *)CONCAT44(uVar1,in_EDX),SUB81((ulong)in_RDI >> 0x38,0));
  *(undefined4 *)((long)in_RDI + 0x424) = 5;
  PortAllocator::PortAllocator(in_stack_00000040);
  return;
}

Assistant:

NetworkCommsInterface::NetworkCommsInterface(gmlc::networking::InterfaceTypes type,
                                             CommsInterface::thread_generation threads) noexcept:
    CommsInterface(threads), networkType(type)
{
}